

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::TcpSocket::SetBufsizeIn(TcpSocket *this,uint s)

{
  char *pcVar1;
  uint local_14;
  uint s_local;
  TcpSocket *this_local;
  
  local_14 = s;
  if (s < 0x200) {
    local_14 = 0x200;
  }
  if (local_14 != this->_inbufSize) {
    pcVar1 = (char *)realloc(this->_inbuf,(ulong)local_14);
    this->_inbuf = pcVar1;
  }
  this->_inbufSize = local_14;
  this->_writeSize = local_14 - 1;
  this->_writeptr = this->_inbuf;
  this->_readptr = this->_inbuf;
  return;
}

Assistant:

void TcpSocket::SetBufsizeIn(unsigned int s)
{
    if(s < 512)
        s = 512;
    if(s != _inbufSize)
        _inbuf = (char*)realloc(_inbuf, s);
    _inbufSize = s;
    _writeSize = s - 1;
    _readptr = _writeptr = _inbuf;
}